

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLMG.cpp
# Opt level: O0

void __thiscall
amrex::MLMG::getEBFluxes
          (MLMG *this,Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *a_eb_flux)

{
  bool bVar1;
  vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *in_RDI;
  Any *s;
  iterator __end1;
  iterator __begin1;
  Vector<amrex::Any,_std::allocator<amrex::Any>_> *__range1;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> solmf;
  MultiFab *in_stack_ffffffffffffff88;
  MLMG *in_stack_ffffffffffffff98;
  char *in_stack_ffffffffffffffa0;
  MultiFab *in_stack_ffffffffffffffa8;
  __normal_iterator<amrex::Any_*,_std::vector<amrex::Any,_std::allocator<amrex::Any>_>_> local_40;
  vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *local_38;
  char *local_8;
  
  bVar1 = MLLinOp::isCellCentered
                    ((MLLinOp *)
                     (((_Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                      &in_RDI[3].
                       super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                       _M_impl)->_M_impl).super__Vector_impl_data._M_start);
  if (!bVar1) {
    local_8 = "getEBFluxes is for cell-centered only";
    Abort_host(in_stack_ffffffffffffffa0);
  }
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::Vector
            ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)0x14fb975);
  local_38 = in_RDI + 6;
  local_40._M_current =
       (Any *)std::vector<amrex::Any,_std::allocator<amrex::Any>_>::begin
                        ((vector<amrex::Any,_std::allocator<amrex::Any>_> *)
                         in_stack_ffffffffffffff88);
  std::vector<amrex::Any,_std::allocator<amrex::Any>_>::end
            ((vector<amrex::Any,_std::allocator<amrex::Any>_> *)in_stack_ffffffffffffff88);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<amrex::Any_*,_std::vector<amrex::Any,_std::allocator<amrex::Any>_>_>
                        *)in_RDI,
                       (__normal_iterator<amrex::Any_*,_std::vector<amrex::Any,_std::allocator<amrex::Any>_>_>
                        *)in_stack_ffffffffffffff88);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<amrex::Any_*,_std::vector<amrex::Any,_std::allocator<amrex::Any>_>_>::
    operator*(&local_40);
    in_stack_ffffffffffffff88 = Any::get<amrex::MultiFab>((Any *)in_stack_ffffffffffffffa8);
    in_stack_ffffffffffffffa8 = in_stack_ffffffffffffff88;
    std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::push_back
              (in_RDI,(value_type *)in_stack_ffffffffffffff88);
    __gnu_cxx::
    __normal_iterator<amrex::Any_*,_std::vector<amrex::Any,_std::allocator<amrex::Any>_>_>::
    operator++(&local_40);
  }
  getEBFluxes(in_stack_ffffffffffffff98,
              (Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)in_RDI,
              (Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
              in_stack_ffffffffffffff88);
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::~Vector
            ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)0x14fba39);
  return;
}

Assistant:

void
MLMG::getEBFluxes (const Vector<MultiFab*>& a_eb_flux)
{
    if (!linop.isCellCentered()) {
       amrex::Abort("getEBFluxes is for cell-centered only");
    }

    AMREX_ASSERT(sol.size() == a_eb_flux.size());
    Vector<MultiFab*> solmf;
    for (auto & s : sol) {
        solmf.push_back(&(s.get<MultiFab>()));
    }
    getEBFluxes(a_eb_flux, solmf);
}